

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_dense.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  int local_10 [2];
  int testCase;
  
  local_10[1] = 0;
  std::istream::operator>>((istream *)&std::cin,local_10);
  bVar1 = runCase(local_10[0]);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"YES!$@*");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"NO");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

int main() {
    int testCase;
    cin>>testCase;
    if (runCase(testCase)) {
        cout<<"YES!$@*"<<endl;
    } else {
        cout<<"NO"<<endl;
    }
    return 0;
}